

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::RunContext::~RunContext(RunContext *this)

{
  undefined1 uVar1;
  int iVar2;
  IStreamingReporter *pIVar3;
  IResultCapture *in_RDI;
  undefined1 in_stack_ffffffffffffff6f;
  AssertionResult *this_00;
  TestRunInfo *_runInfo;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 local_68 [104];
  
  in_RDI->_vptr_IResultCapture = (_func_int **)&PTR__RunContext_00227e28;
  in_RDI[1]._vptr_IResultCapture = (_func_int **)&DAT_00227e98;
  pIVar3 = Ptr<Catch::IStreamingReporter>::operator->
                     ((Ptr<Catch::IStreamingReporter> *)(in_RDI + 0x28));
  this_00 = (AssertionResult *)(in_RDI + 2);
  _runInfo = (TestRunInfo *)(in_RDI + 0x22);
  iVar2 = (*in_RDI->_vptr_IResultCapture[0xb])();
  uVar1 = (undefined1)iVar2;
  TestRunStats::TestRunStats
            ((TestRunStats *)CONCAT17(uVar1,in_stack_ffffffffffffff80),_runInfo,(Totals *)this_00,
             (bool)in_stack_ffffffffffffff6f);
  (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[0xf])(pIVar3,local_68);
  TestRunStats::~TestRunStats((TestRunStats *)0x1a1ad1);
  TestCaseTracking::TrackerContext::~TrackerContext((TrackerContext *)0x1a1ae2);
  std::
  vector<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
  ::~vector((vector<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
             *)CONCAT17(uVar1,in_stack_ffffffffffffff80));
  std::vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_>::~vector
            ((vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_> *)
             CONCAT17(uVar1,in_stack_ffffffffffffff80));
  AssertionInfo::~AssertionInfo(&this_00->m_info);
  std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::~vector
            ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)
             CONCAT17(uVar1,in_stack_ffffffffffffff80));
  Ptr<Catch::IStreamingReporter>::~Ptr((Ptr<Catch::IStreamingReporter> *)this_00);
  Ptr<const_Catch::IConfig>::~Ptr((Ptr<const_Catch::IConfig> *)this_00);
  AssertionResult::~AssertionResult(this_00);
  TestRunInfo::~TestRunInfo((TestRunInfo *)0x1a1b64);
  IRunner::~IRunner((IRunner *)(in_RDI + 1));
  IResultCapture::~IResultCapture(in_RDI);
  return;
}

Assistant:

virtual ~RunContext() {
            m_reporter->testRunEnded( TestRunStats( m_runInfo, m_totals, aborting() ) );
        }